

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void Print<std::__cxx11::list<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
               (list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *d)

{
  ostream *poVar1;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  _List_node_base *p_Var2;
  
  p_Var2 = (_List_node_base *)d;
  while (p_Var2 = (((_List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&p_Var2->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
        p_Var2 != (_List_node_base *)d) {
    poVar1 = std::operator<<((ostream *)&std::cout,(string *)(p_Var2 + 1));
    std::operator<<(poVar1,",");
  }
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  return;
}

Assistant:

void Print(T &d)
{
    for(auto &&e : d)
    {
        cout << e << ",";
    }

    cout << endl;
}